

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_line_splitter.cpp
# Opt level: O0

void __thiscall ExpandTabs_TwoTabs_Test::TestBody(ExpandTabs_TwoTabs_Test *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  char *pcVar5;
  AssertHelper local_110;
  Message local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_d8 [8];
  string out2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in2;
  Message local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  undefined1 local_50 [8];
  string out1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> in1;
  ExpandTabs_TwoTabs_Test *this_local;
  
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&out1.field_2 + 8);
  s_abi_cxx11_(pbVar1,"a\tb\tc",5);
  std::__cxx11::string::string((string *)local_50);
  cVar3 = std::begin<std::__cxx11::string>(pbVar1);
  cVar4 = std::end<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&out1.field_2 + 8));
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::back_inserter<std::__cxx11::string>
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  pstore::dump::
  expand_tabs<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )cVar3._M_current,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )cVar4._M_current,
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[18],_nullptr>
            ((EqHelper *)local_88,"out1","\"a       b       c\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
             (char (*) [18])"a       b       c");
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar2) {
    testing::Message::Message(&local_90);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&in2.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_line_splitter.cpp"
               ,0x3d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)((long)&in2.field_2 + 8),&local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&in2.field_2 + 8));
    testing::Message::~Message(&local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(out1.field_2._M_local_buf + 8));
  pbVar1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&out2.field_2 + 8);
  s_abi_cxx11_(pbVar1,"\t1234567\t12345678",0x11);
  std::__cxx11::string::string((string *)local_d8);
  cVar3 = std::begin<std::__cxx11::string>(pbVar1);
  cVar4 = std::end<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&out2.field_2 + 8));
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )std::back_inserter<std::__cxx11::string>
                   ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  pstore::dump::
  expand_tabs<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::__cxx11::string>>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )cVar3._M_current,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )cVar4._M_current,
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )gtest_ar_1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[25],_nullptr>
            ((EqHelper *)local_100,"out2","\"        1234567 12345678\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
             (char (*) [25])"        1234567 12345678");
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar2) {
    testing::Message::Message(&local_108);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_line_splitter.cpp"
               ,0x43,pcVar5);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)(out2.field_2._M_local_buf + 8));
  return;
}

Assistant:

TEST (ExpandTabs, TwoTabs) {
    {
        auto const in1 = "a\tb\tc"s;
        std::string out1;
        pstore::dump::expand_tabs (std::begin (in1), std::end (in1), std::back_inserter (out1), 8U);
        EXPECT_EQ (out1, "a       b       c");
    }
    {
        auto const in2 = "\t1234567\t12345678"s;
        std::string out2;
        pstore::dump::expand_tabs (std::begin (in2), std::end (in2), std::back_inserter (out2), 8U);
        EXPECT_EQ (out2, "        1234567 12345678");
    }
}